

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O0

void __thiscall
ParserTest_InvalidFunctionCallsThrow_Test::~ParserTest_InvalidFunctionCallsThrow_Test
          (ParserTest_InvalidFunctionCallsThrow_Test *this)

{
  void *in_RDI;
  
  ~ParserTest_InvalidFunctionCallsThrow_Test((ParserTest_InvalidFunctionCallsThrow_Test *)0x1dbfd8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(ParserTest, InvalidFunctionCallsThrow)
{
  const auto func = std::bind(&Parser::parseFunctionCall, std::placeholders::_1, std::optional<Token>{});
  testThrow("f(", func);
  testThrow("f)", func);
  testThrow("f(x,)", func);
  testThrow("f(x y)", func);
  testThrow("(x y)", func);
}